

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

void get_alsa_error_text(char *msg,int len,int err)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (char *)snd_strerror(err);
  sVar2 = strlen(pcVar1);
  if ((int)sVar2 < len) {
    pcVar1 = (char *)snd_strerror(err);
    strcpy(msg,pcVar1);
    return;
  }
  if (0x14 < len) {
    sprintf(msg,"Alsa error %d",(ulong)(uint)err);
    return;
  }
  if (len < 5) {
    *msg = '\0';
  }
  else {
    builtin_strncpy(msg,"Alsa",5);
  }
  return;
}

Assistant:

static void get_alsa_error_text(char *msg, int len, int err)
{
    int errlen = strlen(snd_strerror(err));
    if (errlen < len) {
        strcpy(msg, snd_strerror(err));
    } else if (len > 20) {
        sprintf(msg, "Alsa error %d", err);
    } else if (len > 4) {
        strcpy(msg, "Alsa");
    } else {
        msg[0] = 0;
    }
}